

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O1

coop_t * __thiscall
so_5::impl::coop_repository_basis_t::find_parent_coop_if_necessary
          (coop_repository_basis_t *this,coop_t *coop_to_be_registered)

{
  bool bVar1;
  string *psVar2;
  const_iterator cVar3;
  long *plVar4;
  coop_t *pcVar5;
  long *plVar6;
  long *local_58;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = coop_t::has_parent_coop(coop_to_be_registered);
  if (bVar1) {
    psVar2 = coop_t::parent_coop_name_abi_cxx11_(coop_to_be_registered);
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
            ::find(&(this->m_registered_coop)._M_t,psVar2);
    if (&(this->m_registered_coop)._M_t._M_impl.super__Rb_tree_header ==
        (_Rb_tree_header *)cVar3._M_node) {
      psVar2 = coop_t::parent_coop_name_abi_cxx11_(coop_to_be_registered);
      std::operator+(&local_38,"parent coop with name \"",psVar2);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_48 = *plVar6;
        lStack_40 = plVar4[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar6;
        local_58 = (long *)*plVar4;
      }
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      exception_t::raise(0x24d852);
      if (local_58 != &local_48) {
        operator_delete(local_58);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
    }
    pcVar5 = *(coop_t **)(cVar3._M_node + 2);
  }
  else {
    pcVar5 = (coop_t *)0x0;
  }
  return pcVar5;
}

Assistant:

coop_t *
coop_repository_basis_t::find_parent_coop_if_necessary(
	const coop_t & coop_to_be_registered ) const
{
	if( coop_to_be_registered.has_parent_coop() )
	{
		auto it = m_registered_coop.find(
				coop_to_be_registered.parent_coop_name() );
		if( m_registered_coop.end() == it )
		{
			SO_5_THROW_EXCEPTION(
				rc_parent_coop_not_found,
				"parent coop with name \"" +
					coop_to_be_registered.parent_coop_name() +
					"\" is not registered" );
		}

		return it->second.get();
	}

	return nullptr;
}